

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_convert.c
# Opt level: O0

int convert_glob_parse_range
              (PCRE2_SPTR16 *from,PCRE2_SPTR16 pattern_end,pcre2_output_context *out,BOOL utf,
              PCRE2_UCHAR16 separator,BOOL with_escape,PCRE2_UCHAR16 escape,BOOL no_wildsep)

{
  bool bVar1;
  bool bVar2;
  int class_index_00;
  BOOL BVar3;
  ushort *puVar4;
  PCRE2_SPTR16 pPVar5;
  bool bVar6;
  int local_5c;
  int class_index;
  int len;
  uint32_t prev_c;
  uint32_t c;
  PCRE2_SPTR16 char_start;
  PCRE2_SPTR16 pattern;
  BOOL has_prev_c;
  BOOL separator_seen;
  BOOL is_negative;
  BOOL with_escape_local;
  PCRE2_UCHAR16 separator_local;
  BOOL utf_local;
  pcre2_output_context *out_local;
  PCRE2_SPTR16 pattern_end_local;
  PCRE2_SPTR16 *from_local;
  
  bVar1 = false;
  bVar2 = false;
  char_start = *from;
  if (char_start < pattern_end) {
    if ((*char_start == 0x21) || (*char_start == 0x5e)) {
      char_start = char_start + 1;
      if (pattern_end <= char_start) {
        *from = char_start;
        return 0x6a;
      }
      bVar1 = true;
      out->out_str[0] = '[';
      out->out_str[1] = '^';
      local_5c = 2;
      if (no_wildsep == 0) {
        if (with_escape != 0) {
          out->out_str[2] = '\\';
          local_5c = 3;
        }
        out->out_str[local_5c] = (uint8_t)separator;
      }
      convert_glob_write_str(out,(long)(local_5c + 1));
    }
    else {
      convert_glob_write(out,0x5b);
    }
    class_index = 0;
    bVar6 = *char_start == 0x5d;
    if (bVar6) {
      out->out_str[0] = '\\';
      out->out_str[1] = ']';
      convert_glob_write_str(out,2);
      class_index = 0x5d;
      char_start = char_start + 1;
    }
LAB_00152ebf:
    pPVar5 = char_start;
    if (char_start < pattern_end) {
      _prev_c = char_start;
      puVar4 = char_start + 1;
      len = (int)*char_start;
      if (len == 0x5d) {
        convert_glob_write(out,*char_start);
        if (((!bVar1) && (no_wildsep == 0)) && (bVar2)) {
          builtin_memcpy(out->out_str,"(?<!",4);
          convert_glob_write_str(out,4);
          convert_glob_print_separator(out,separator,with_escape);
          convert_glob_write(out,0x29);
        }
        *from = puVar4;
        return 0;
      }
      pPVar5 = puVar4;
      if (pattern_end <= puVar4) goto LAB_001531ba;
      if ((len == 0x5b) && (*puVar4 == 0x3a)) {
        *from = puVar4;
        class_index_00 = convert_glob_parse_class(from,pattern_end,out);
        char_start = puVar4;
        if (class_index_00 != 0) {
          char_start = *from;
          bVar6 = false;
          class_index = 0;
          if ((!bVar1) && (BVar3 = convert_glob_char_in_class(class_index_00,separator), BVar3 != 0)
             ) {
            bVar2 = true;
          }
          goto LAB_00152ebf;
        }
      }
      else if ((len == 0x2d) && ((bVar6 && (*puVar4 != 0x5d)))) {
        convert_glob_write(out,0x2d);
        pPVar5 = char_start + 2;
        len = (int)*puVar4;
        if (pattern_end <= pPVar5) goto LAB_001531ba;
        if ((escape == 0) || (len != (uint)escape)) {
          _prev_c = puVar4;
          char_start = pPVar5;
          if ((len == 0x5b) && (*pPVar5 == 0x3a)) {
            *from = pPVar5;
            return -0x40;
          }
        }
        else {
          len = (int)*pPVar5;
          _prev_c = pPVar5;
          char_start = char_start + 3;
        }
        if ((uint)len < (uint)class_index) {
          *from = char_start;
          return -0x40;
        }
        if (((uint)class_index < (uint)separator) && ((uint)separator < (uint)len)) {
          bVar2 = true;
        }
        bVar6 = false;
        class_index = 0;
      }
      else {
        if ((escape != 0) && (len == (uint)escape)) {
          pPVar5 = char_start + 2;
          len = (int)*puVar4;
          _prev_c = puVar4;
          puVar4 = pPVar5;
          if (pattern_end <= pPVar5) goto LAB_001531ba;
        }
        char_start = puVar4;
        bVar6 = true;
        class_index = len;
      }
      if ((((len == 0x5b) || (len == 0x5d)) || (len == 0x5c)) || (len == 0x2d)) {
        convert_glob_write(out,0x5c);
      }
      if (len == (uint)separator) {
        bVar2 = true;
      }
      do {
        puVar4 = _prev_c + 1;
        convert_glob_write(out,*_prev_c);
        _prev_c = puVar4;
      } while (puVar4 < char_start);
      goto LAB_00152ebf;
    }
LAB_001531ba:
    char_start = pPVar5;
    *from = char_start;
  }
  else {
    *from = char_start;
  }
  return 0x6a;
}

Assistant:

static int
convert_glob_parse_range(PCRE2_SPTR *from, PCRE2_SPTR pattern_end,
  pcre2_output_context *out, BOOL utf, PCRE2_UCHAR separator,
  BOOL with_escape, PCRE2_UCHAR escape, BOOL no_wildsep)
{
BOOL is_negative = FALSE;
BOOL separator_seen = FALSE;
BOOL has_prev_c;
PCRE2_SPTR pattern = *from;
PCRE2_SPTR char_start = NULL;
uint32_t c, prev_c;
int len, class_index;

(void)utf; /* Avoid compiler warning. */

if (pattern >= pattern_end)
  {
  *from = pattern;
  return PCRE2_ERROR_MISSING_SQUARE_BRACKET;
  }

if (*pattern == CHAR_EXCLAMATION_MARK
    || *pattern == CHAR_CIRCUMFLEX_ACCENT)
  {
  pattern++;

  if (pattern >= pattern_end)
    {
    *from = pattern;
    return PCRE2_ERROR_MISSING_SQUARE_BRACKET;
    }

  is_negative = TRUE;

  out->out_str[0] = CHAR_LEFT_SQUARE_BRACKET;
  out->out_str[1] = CHAR_CIRCUMFLEX_ACCENT;
  len = 2;

  if (!no_wildsep)
    {
    if (with_escape)
      {
      out->out_str[len] = CHAR_BACKSLASH;
      len++;
      }
    out->out_str[len] = (uint8_t) separator;
    }

  convert_glob_write_str(out, len + 1);
  }
else
  convert_glob_write(out, CHAR_LEFT_SQUARE_BRACKET);

has_prev_c = FALSE;
prev_c = 0;

if (*pattern == CHAR_RIGHT_SQUARE_BRACKET)
  {
  out->out_str[0] = CHAR_BACKSLASH;
  out->out_str[1] = CHAR_RIGHT_SQUARE_BRACKET;
  convert_glob_write_str(out, 2);
  has_prev_c = TRUE;
  prev_c = CHAR_RIGHT_SQUARE_BRACKET;
  pattern++;
  }

while (pattern < pattern_end)
  {
  char_start = pattern;
  GETCHARINCTEST(c, pattern);

  if (c == CHAR_RIGHT_SQUARE_BRACKET)
    {
    convert_glob_write(out, c);

    if (!is_negative && !no_wildsep && separator_seen)
      {
      out->out_str[0] = CHAR_LEFT_PARENTHESIS;
      out->out_str[1] = CHAR_QUESTION_MARK;
      out->out_str[2] = CHAR_LESS_THAN_SIGN;
      out->out_str[3] = CHAR_EXCLAMATION_MARK;
      convert_glob_write_str(out, 4);

      convert_glob_print_separator(out, separator, with_escape);
      convert_glob_write(out, CHAR_RIGHT_PARENTHESIS);
      }

    *from = pattern;
    return 0;
    }

  if (pattern >= pattern_end) break;

  if (c == CHAR_LEFT_SQUARE_BRACKET && *pattern == CHAR_COLON)
    {
    *from = pattern;
    class_index = convert_glob_parse_class(from, pattern_end, out);

    if (class_index != 0)
      {
      pattern = *from;

      has_prev_c = FALSE;
      prev_c = 0;

      if (!is_negative &&
          convert_glob_char_in_class (class_index, separator))
        separator_seen = TRUE;
      continue;
      }
    }
  else if (c == CHAR_MINUS && has_prev_c &&
           *pattern != CHAR_RIGHT_SQUARE_BRACKET)
    {
    convert_glob_write(out, CHAR_MINUS);

    char_start = pattern;
    GETCHARINCTEST(c, pattern);

    if (pattern >= pattern_end) break;

    if (escape != 0 && c == escape)
      {
      char_start = pattern;
      GETCHARINCTEST(c, pattern);
      }
    else if (c == CHAR_LEFT_SQUARE_BRACKET && *pattern == CHAR_COLON)
      {
      *from = pattern;
      return PCRE2_ERROR_CONVERT_SYNTAX;
      }

    if (prev_c > c)
      {
      *from = pattern;
      return PCRE2_ERROR_CONVERT_SYNTAX;
      }

    if (prev_c < separator && separator < c) separator_seen = TRUE;

    has_prev_c = FALSE;
    prev_c = 0;
    }
  else
    {
    if (escape != 0 && c == escape)
      {
      char_start = pattern;
      GETCHARINCTEST(c, pattern);

      if (pattern >= pattern_end) break;
      }

    has_prev_c = TRUE;
    prev_c = c;
    }

  if (c == CHAR_LEFT_SQUARE_BRACKET || c == CHAR_RIGHT_SQUARE_BRACKET ||
      c == CHAR_BACKSLASH || c == CHAR_MINUS)
    convert_glob_write(out, CHAR_BACKSLASH);

  if (c == separator) separator_seen = TRUE;

  do convert_glob_write(out, *char_start++); while (char_start < pattern);
  }

*from = pattern;
return PCRE2_ERROR_MISSING_SQUARE_BRACKET;
}